

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

QDebug operator<<(QDebug d,QAction *action)

{
  int iVar1;
  long lVar2;
  QAction *in_RDX;
  QKeySequence *pQVar3;
  char *pcVar4;
  storage_type *psVar5;
  QTextStream *pQVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QDebugStateSaver saver;
  QDebug local_78;
  QtPrivate local_70 [8];
  undefined1 *local_68;
  undefined1 local_60 [16];
  QArrayDataPointer<QKeySequence> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_68,(QDebug *)action);
  pQVar6 = *(QTextStream **)action;
  pQVar6[0x30] = (QTextStream)0x0;
  QVar8.m_data = &DAT_00000008;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar6,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = *(QTextStream **)action;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)action;
  }
  QTextStream::operator<<(pQVar6,in_RDX);
  pQVar6 = *(QTextStream **)action;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)action;
  }
  if (in_RDX == (QAction *)0x0) goto LAB_0058fb38;
  QVar9.m_data = &DAT_00000006;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar6,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  QAction::text((QString *)&local_50,in_RDX);
  pQVar3 = local_50.ptr;
  if (local_50.ptr == (QKeySequence *)0x0) {
    pQVar3 = (QKeySequence *)&QString::_empty;
  }
  QDebug::putString((QChar *)action,(ulong)pQVar3);
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  QAction::toolTip((QString *)&local_50,in_RDX);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_50.size != 0) {
    pQVar6 = *(QTextStream **)action;
    QVar10.m_data = (storage_type *)0x9;
    QVar10.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<(pQVar6,(QString *)&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)action,' ');
    }
    QAction::toolTip((QString *)&local_50,in_RDX);
    if (local_50.ptr == (QKeySequence *)0x0) {
      local_50.ptr = (QKeySequence *)&QString::_empty;
    }
    QDebug::putString((QChar *)action,(ulong)local_50.ptr);
    if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)action,' ');
    }
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((*(byte *)(*(long *)&in_RDX->field_0x8 + 0x188) & 0x20) != 0) {
    pQVar6 = *(QTextStream **)action;
    QVar11.m_data = (storage_type *)0x9;
    QVar11.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<(pQVar6,(QString *)&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar6 = *(QTextStream **)action;
    if (pQVar6[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar6,' ');
      pQVar6 = *(QTextStream **)action;
    }
    pcVar4 = "false";
    if ((~*(uint *)(*(long *)&in_RDX->field_0x8 + 0x188) & 0x60) == 0) {
      pcVar4 = "true";
    }
    QTextStream::operator<<(pQVar6,pcVar4);
    if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)action,' ');
    }
  }
  lVar2 = *(long *)&in_RDX->field_0x8;
  local_50.d = *(Data **)(lVar2 + 0x108);
  local_50.ptr = *(QKeySequence **)(lVar2 + 0x110);
  lVar2 = *(long *)(lVar2 + 0x118);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.size = lVar2;
  QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&local_50);
  if (lVar2 != 0) {
    pQVar6 = *(QTextStream **)action;
    QVar12.m_data = (storage_type *)0xb;
    QVar12.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(pQVar6,(QString *)&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    local_60._0_8_ = *(undefined8 *)action;
    if (*(QTextStream *)(local_60._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60._0_8_,' ');
      local_60._0_8_ = *(undefined8 *)action;
    }
    *(int *)(local_60._0_8_ + 0x28) = *(int *)(local_60._0_8_ + 0x28) + 1;
    lVar2 = *(long *)&in_RDX->field_0x8;
    local_50.d = *(Data **)(lVar2 + 0x108);
    local_50.ptr = *(QKeySequence **)(lVar2 + 0x110);
    local_50.size = *(long *)(lVar2 + 0x118);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<QKeySequence>>
              (local_70,(Stream *)local_60,"QList",(QList<QKeySequence> *)&local_50);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)local_70);
    QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&local_50);
    QDebug::~QDebug(&local_78);
  }
  pQVar6 = *(QTextStream **)action;
  QVar13.m_data = (storage_type *)0xa;
  QVar13.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar13);
  QTextStream::operator<<(pQVar6,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)action)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)action,' ');
  }
  iVar1 = *(int *)(*(long *)&in_RDX->field_0x8 + 0x18c);
  QMetaObject::indexOfEnumerator((char *)&QAction::staticMetaObject);
  local_60 = QMetaObject::enumerator(0x7dff20);
  lVar2 = QMetaEnum::valueToKey((ulonglong)local_60);
  pQVar6 = *(QTextStream **)action;
  if (lVar2 == 0) {
    QTextStream::operator<<(pQVar6,iVar1);
    pQVar6 = *(QTextStream **)action;
    if (pQVar6[0x30] == (QTextStream)0x1) goto LAB_0058f9f8;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar4 = psVar5 + lVar2 + 1;
      psVar5 = psVar5 + 1;
    } while (*pcVar4 != '\0');
    QVar14.m_data = psVar5;
    QVar14.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<(pQVar6,(QString *)&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar6 = *(QTextStream **)action;
    if (pQVar6[0x30] != (QTextStream)0x0) {
LAB_0058f9f8:
      QTextStream::operator<<(pQVar6,' ');
      pQVar6 = *(QTextStream **)action;
    }
  }
  QVar15.m_data = (storage_type *)0x9;
  QVar15.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar15);
  QTextStream::operator<<(pQVar6,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = *(QTextStream **)action;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)action;
  }
  pcVar7 = "true";
  pcVar4 = "true";
  if ((*(ushort *)(*(long *)&in_RDX->field_0x8 + 0x188) & 1) == 0) {
    pcVar4 = "false";
  }
  QTextStream::operator<<(pQVar6,pcVar4);
  pQVar6 = *(QTextStream **)action;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)action;
  }
  QVar16.m_data = (storage_type *)0x9;
  QVar16.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar16);
  QTextStream::operator<<(pQVar6,(QString *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = *(QTextStream **)action;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)action;
  }
  if ((*(ushort *)(*(long *)&in_RDX->field_0x8 + 0x188) & 8) == 0) {
    pcVar7 = "false";
  }
  QTextStream::operator<<(pQVar6,pcVar7);
  pQVar6 = *(QTextStream **)action;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)action;
  }
LAB_0058fb38:
  QTextStream::operator<<(pQVar6,')');
  pQVar6 = *(QTextStream **)action;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)action;
  }
  *(undefined8 *)action = 0;
  *(QTextStream **)d.stream = pQVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)d.stream;
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug d, const QAction *action)
{
    QDebugStateSaver saver(d);
    d.nospace();
    d << "QAction(" << static_cast<const void *>(action);
    if (action) {
        d << " text=" << action->text();
        if (!action->toolTip().isEmpty())
            d << " toolTip=" << action->toolTip();
        if (action->isCheckable())
            d << " checked=" << action->isChecked();
#if QT_CONFIG(shortcut)
        if (!action->shortcuts().isEmpty())
            d << " shortcuts=" << action->shortcuts();
#endif
        d << " menuRole=";
        QtDebugUtils::formatQEnum(d, action->menuRole());
        d << " enabled=" << action->isEnabled();
        d << " visible=" << action->isVisible();
    }
    d << ')';
    return d;
}